

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O3

Var Js::JavascriptWeakMap::EntryDelete(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  EventLog *this;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptWeakMap *this_00;
  RecyclableObject *pRVar7;
  JavascriptBoolean *pJVar8;
  int in_stack_00000010;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                ,0x93,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_40 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_40,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pvVar6 = Arguments::operator[]((Arguments *)local_40,0);
  bVar3 = VarIs<Js::JavascriptWeakMap>(pvVar6);
  if (bVar3) {
    pvVar6 = Arguments::operator[]((Arguments *)local_40,0);
    this_00 = VarTo<Js::JavascriptWeakMap>(pvVar6);
    if (((ulong)local_40 & 0xfffffe) == 0) {
      pRVar7 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
    }
    else {
      pRVar7 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_40,1);
    }
    BVar4 = JavascriptOperators::IsObject(pRVar7);
    if (BVar4 == 0) {
      bVar3 = false;
    }
    else {
      pRVar7 = VarTo<Js::RecyclableObject>(pRVar7);
      bVar3 = Delete(this_00,pRVar7);
    }
    if (pSVar1->TTDRecordOrReplayModeEnabled == true) {
      this = ((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
              scriptContext.ptr)->threadContext->TTDLog;
      if (pSVar1->TTDRecordModeEnabled == true) {
        TTD::EventLog::RecordWeakCollectionContainsEvent(this,bVar3);
      }
      else {
        bVar3 = TTD::EventLog::ReplayWeakCollectionContainsEvent(this);
      }
    }
    pJVar8 = JavascriptLibrary::CreateBoolean
                       ((pSVar1->super_ScriptContextBase).javascriptLibrary,(uint)bVar3);
    return pJVar8;
  }
  JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"WeakMap.prototype.delete",L"WeakMap");
}

Assistant:

Var JavascriptWeakMap::EntryDelete(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (!VarIs<JavascriptWeakMap>(args[0]))
        {
            JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("WeakMap.prototype.delete"), _u("WeakMap"));
        }

        JavascriptWeakMap* weakMap = VarTo<JavascriptWeakMap>(args[0]);

        Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();
        bool didDelete = false;

        if (JavascriptOperators::IsObject(key))
        {
            RecyclableObject* keyObj = VarTo<RecyclableObject>(key);

            didDelete = weakMap->Delete(keyObj);
        }

#if ENABLE_TTD
        if(scriptContext->IsTTDRecordOrReplayModeEnabled())
        {
            if(scriptContext->IsTTDRecordModeEnabled())
            {
                function->GetScriptContext()->GetThreadContext()->TTDLog->RecordWeakCollectionContainsEvent(didDelete);
            }
            else
            {
                didDelete = function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayWeakCollectionContainsEvent();
            }
        }
#endif

        return scriptContext->GetLibrary()->CreateBoolean(didDelete);
    }